

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O1

string * __thiscall
bssl::CertErrors::ToDebugString_abi_cxx11_(string *__return_storage_ptr__,CertErrors *this)

{
  pointer pCVar1;
  pointer this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (this->nodes_).super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->nodes_).super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pCVar1) {
    do {
      CertError::ToDebugString_abi_cxx11_(&local_50,this_00);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CertErrors::ToDebugString() const {
  std::string result;
  for (const CertError &node : nodes_) {
    result += node.ToDebugString();
  }

  return result;
}